

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make<bool,bool>(any *this,bool *args)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((_DAT_00340ff8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar1 = *(baseHolder **)
              (&holder<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>>::allocator +
              _DAT_00340ff8 * 8);
    _DAT_00340ff8 = _DAT_00340ff8 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_0032e4e0;
  *(bool *)&pbVar1[1]._vptr_baseHolder = *args;
  if ((DAT_00344820 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_00344820];
    DAT_00344820 = DAT_00344820 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}